

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O3

void pd_undo_set_objectstate
               (_glist *canvas,t_pd *x,t_symbol *s,int undo_argc,t_atom *undo_argv,int redo_argc,
               t_atom *redo_argv)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  _undo *p_Var5;
  long lVar6;
  int *data;
  _binbuf *p_Var7;
  int iVar8;
  
  iVar4 = glist_getindex(canvas,(t_gobj *)x);
  p_Var5 = canvas_undo_get(canvas);
  if ((p_Var5 == (_undo *)0x0) || (p_Var5->u_doing == 0)) {
    if (undo_argc != redo_argc) {
LAB_00164e29:
      data = (int *)getbytes(0x20);
      *data = iVar4;
      *(t_symbol **)(data + 2) = s;
      p_Var7 = binbuf_new();
      *(_binbuf **)(data + 4) = p_Var7;
      p_Var7 = binbuf_new();
      *(_binbuf **)(data + 6) = p_Var7;
      binbuf_add(*(_binbuf **)(data + 4),undo_argc,undo_argv);
      binbuf_add(*(_binbuf **)(data + 6),redo_argc,redo_argv);
      canvas_undo_add(canvas,UNDO_OBJECT_STATE,"state",data);
      return;
    }
    if (0 < undo_argc) {
      lVar6 = 8;
      iVar8 = undo_argc;
      do {
        iVar3 = *(int *)((long)undo_argv + lVar6 + -8);
        if (iVar3 != *(int *)((long)redo_argv + lVar6 + -8)) goto LAB_00164e29;
        if (iVar3 == 1) {
          fVar2 = *(float *)((long)&undo_argv->a_type + lVar6);
          pfVar1 = (float *)((long)&redo_argv->a_type + lVar6);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_00164e29;
        }
        else if ((iVar3 != 2) ||
                (*(long *)((long)&undo_argv->a_type + lVar6) !=
                 *(long *)((long)&redo_argv->a_type + lVar6))) goto LAB_00164e29;
        lVar6 = lVar6 + 0x10;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  return;
}

Assistant:

void pd_undo_set_objectstate(t_canvas*canvas, t_pd*x, t_symbol*s,
                                    int undo_argc, t_atom*undo_argv,
                                    int redo_argc, t_atom*redo_argv)
{
    t_undo_object_state *buf;
    int pos = glist_getindex(canvas, (t_gobj*)x);
    t_undo *udo = canvas_undo_get(canvas);
    if (udo && udo->u_doing)
        return;
    if(lists_are_equal(undo_argc, undo_argv, redo_argc, redo_argv))
        return;

    buf = (t_undo_object_state*)getbytes(sizeof(t_undo_object_state));
    buf->u_obj = pos;
    buf->u_symbol = s;
    buf->u_undo = binbuf_new();
    buf->u_redo = binbuf_new();
    binbuf_add(buf->u_undo, undo_argc, undo_argv);
    binbuf_add(buf->u_redo, redo_argc, redo_argv);
#if 0
    startpost("UNDO:"); binbuf_print(buf->u_undo);
    startpost("REDO:"); binbuf_print(buf->u_redo);
#endif
    canvas_undo_add(canvas, UNDO_OBJECT_STATE, "state", buf);
}